

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O3

bool ON_GetParameterTolerance(double t0,double t1,double t,double *tminus,double *tplus)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  if (t0 < t1) {
    dVar3 = t0;
    if ((t0 <= t) && (dVar3 = t, t1 < t)) {
      dVar3 = t1;
    }
    dVar2 = t1 - t0;
    dVar4 = dVar2 * 8.0 * 1.490116119385e-08 + (ABS(t1) + ABS(t0)) * 2.220446049250313e-16;
    uVar1 = -(ulong)(dVar4 < dVar2);
    dVar2 = (double)(~uVar1 & (ulong)(dVar2 * 0.5) | (ulong)dVar4 & uVar1);
    if (tminus != (double *)0x0) {
      *tminus = dVar3 - dVar2;
    }
    if (tplus != (double *)0x0) {
      *tplus = dVar2 + dVar3;
    }
  }
  return t0 < t1;
}

Assistant:

bool 
ON_GetParameterTolerance(
        double t0, double t1, // domain
        double t,          // parameter in domain
        double* tminus, double* tplus// parameter tolerance (tminus, tplus) returned here
        )
{
  const bool rc = (t0 < t1) ? true : false;
  if ( rc ) {
    if ( t < t0 )
      t = t0;
    else if (t > t1 )
      t = t1;
    double dt = (t1-t0)*8.0* ON_SQRT_EPSILON + (fabs(t0) + fabs(t1))* ON_EPSILON;
    if ( dt >= t1-t0 )
      dt = 0.5*(t1-t0);
    const double tmin = t-dt;
    const double tmax = t+dt;
    if ( tminus )
      *tminus = tmin;
    if ( tplus )
      *tplus = tmax;
  }

  return rc;
}